

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

const_iterator * __thiscall
Catch::TextFlow::Column::const_iterator::operator++(const_iterator *this)

{
  Column *pCVar1;
  char *pcVar2;
  byte *pbVar3;
  
  (this->m_lineStart).m_string = (this->m_lineEnd).m_string;
  (this->m_lineStart).m_it._M_current = (this->m_lineEnd).m_it._M_current;
  pCVar1 = this->m_column;
  pcVar2 = (this->m_lineStart).m_it._M_current;
  if ((pcVar2 == (pCVar1->m_string).m_string._M_dataplus._M_p +
                 (pCVar1->m_string).m_string._M_string_length) || (*pcVar2 != '\n')) {
    pbVar3 = (byte *)(this->m_lineStart).m_it._M_current;
    if (pbVar3 != (byte *)((pCVar1->m_string).m_string._M_dataplus._M_p +
                          (pCVar1->m_string).m_string._M_string_length)) {
      do {
        if ((0x20 < (ulong)*pbVar3) || ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0)) break;
        (this->m_lineStart).m_it._M_current = (char *)(pbVar3 + 1);
        AnsiSkippingString::const_iterator::tryParseAnsiEscapes(&this->m_lineStart);
        pbVar3 = (byte *)(this->m_lineStart).m_it._M_current;
      } while (pbVar3 != (byte *)((pCVar1->m_string).m_string._M_dataplus._M_p +
                                 (pCVar1->m_string).m_string._M_string_length));
    }
  }
  else {
    (this->m_lineStart).m_it._M_current = pcVar2 + 1;
    AnsiSkippingString::const_iterator::tryParseAnsiEscapes(&this->m_lineStart);
  }
  if ((this->m_lineStart).m_it._M_current !=
      (pCVar1->m_string).m_string._M_dataplus._M_p + (pCVar1->m_string).m_string._M_string_length) {
    calcLength(this);
  }
  return this;
}

Assistant:

Column::const_iterator& Column::const_iterator::operator++() {
            m_lineStart = m_lineEnd;
            AnsiSkippingString const& current_line = m_column.m_string;
            if ( m_lineStart != current_line.end() && *m_lineStart == '\n' ) {
                m_lineStart++;
            } else {
                while ( m_lineStart != current_line.end() &&
                        isWhitespace( *m_lineStart ) ) {
                    ++m_lineStart;
                }
            }

            if ( m_lineStart != current_line.end() ) { calcLength(); }
            return *this;
        }